

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int is_undirected_automorphism(saucy *s)

{
  int iVar1;
  int iVar2;
  sim_result *psVar3;
  sim_result *cex;
  int ret;
  int j;
  int i;
  saucy *s_local;
  
  ret = 0;
  while( true ) {
    if (s->ndiffs <= ret) {
      iVar1 = Abc_NtkCecSat_saucy(s->pNtk,s->pNtk_permuted,s->pModel);
      if (iVar1 == 0) {
        psVar3 = analyzeConflict(s->pNtk,s->pModel,s->fPrintTree);
        add_conterexample(s,psVar3);
        psVar3 = analyzeConflict(s->pNtk_permuted,s->pModel,s->fPrintTree);
        add_conterexample(s,psVar3);
        s->activityInc = s->activityInc * 1.1111111111111112;
        iVar2 = Vec_PtrSize(s->satCounterExamples);
        if (0x31 < iVar2) {
          reduceDB(s);
        }
      }
      return iVar1;
    }
    iVar1 = check_mapping(s,s->adj,s->edg,s->unsupp[ret]);
    if (iVar1 == 0) break;
    ret = ret + 1;
  }
  return 0;
}

Assistant:

static int
is_undirected_automorphism(struct saucy *s)
{
    int i, j, ret;  

    for (i = 0; i < s->ndiffs; ++i) {
        j = s->unsupp[i];
        if (!check_mapping(s, s->adj, s->edg, j)) return 0;
    }

    ret = Abc_NtkCecSat_saucy(s->pNtk, s->pNtk_permuted, s->pModel);
    
    if( BACKTRACK_BY_SAT && !ret ) {
        struct sim_result * cex;

        cex = analyzeConflict( s->pNtk, s->pModel, s->fPrintTree );
        add_conterexample(s, cex);

        cex = analyzeConflict( s->pNtk_permuted, s->pModel, s->fPrintTree );
        add_conterexample(s, cex);      
        
        s->activityInc *= (1 / CLAUSE_DECAY);
        if (Vec_PtrSize(s->satCounterExamples) >= MAX_LEARNTS)
            reduceDB(s);
    }

    return ret;
}